

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::schema::Node::Which,capnp::schema::Node::Which&>&,char_const(&)[46],unsigned_long&,unsigned_int,unsigned_int,capnp::Text::Reader>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<capnp::schema::Node::Which,_capnp::schema::Node::Which_&> *params,
          char (*params_1) [46],unsigned_long *params_2,uint *params_3,uint *params_4,
          Reader *params_5)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  char (*params_00) [46];
  unsigned_long *params_01;
  uint *params_02;
  uint *params_03;
  Reader *params_04;
  long lVar4;
  String argValues [6];
  long *plVar5;
  undefined8 uVar6;
  long local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  long local_c8 [3];
  String local_b0;
  String local_98;
  String local_80;
  String local_68;
  String local_50;
  
  this->exception = (Exception *)0x0;
  _::operator*(&local_e8,params,CONCAT44(in_register_00000014,line),
               CONCAT44(in_register_0000000c,code));
  local_c8[0] = local_e8;
  local_c8[1] = local_e0;
  local_c8[2] = uStack_d8;
  str<char_const(&)[46]>(&local_b0,(kj *)params_1,params_00);
  str<unsigned_long&>(&local_98,(kj *)params_2,params_01);
  str<unsigned_int&>(&local_80,(kj *)params_3,params_02);
  str<unsigned_int&>(&local_68,(kj *)params_4,params_03);
  str<capnp::Text::Reader&>(&local_50,(kj *)params_5,params_04);
  plVar5 = local_c8;
  uVar6 = 6;
  init(this,(EVP_PKEY_CTX *)file);
  lVar4 = 0x78;
  do {
    lVar1 = *(long *)((long)local_c8 + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)local_c8 + lVar4 + 8);
      *(undefined8 *)((long)local_c8 + lVar4) = 0;
      *(undefined8 *)((long)local_c8 + lVar4 + 8) = 0;
      puVar3 = *(undefined8 **)((long)local_c8 + lVar4 + 0x10);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0,plVar5,uVar6);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}